

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

QIcon __thiscall QCss::Declaration::iconValue(Declaration *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long *in_RSI;
  long lVar7;
  Mode mode;
  long lVar8;
  long in_FS_OFFSET;
  int local_84;
  State local_80;
  QPixmap local_70;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(ulong *)(*in_RSI + 0x58) < 4) {
    (this->d).d.ptr = (DeclarationData *)&DAT_aaaaaaaaaaaaaaaa;
    QIcon::QIcon((QIcon *)this);
    iVar5 = 0;
    do {
      lVar8 = (long)iVar5;
      if ((*(long *)(*in_RSI + 0x38) <= lVar8) ||
         (*(int *)(*(long *)(*in_RSI + 0x30) + lVar8 * 0x28) != 7)) break;
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::toString();
      iVar3 = iVar5 + 2;
      local_84 = iVar5 + 3;
      lVar6 = lVar8 * 0x28 + 0x30;
      mode = Normal;
      local_80 = Off;
      for (lVar7 = 0; iVar4 = (int)lVar7, iVar4 != 2; lVar7 = lVar7 + 1) {
        if ((lVar8 + 1 + lVar7 == *(long *)(*in_RSI + 0x38)) ||
           (lVar1 = *(long *)(*in_RSI + 0x30), *(int *)(lVar1 + -8 + lVar6) != 6)) {
          iVar3 = iVar5 + iVar4;
          local_84 = iVar5 + iVar4 + 1;
          break;
        }
        iVar4 = ::QVariant::toInt((bool *)(lVar1 + lVar6));
        switch(iVar4) {
        case 0x51:
          mode = Disabled;
          break;
        case 0x52:
          mode = Active;
          break;
        case 0x53:
          mode = Selected;
          break;
        case 0x54:
          local_80 = On;
          break;
        case 0x55:
          local_80 = Off;
          break;
        default:
          if (iVar4 == 1) {
            mode = Normal;
          }
        }
        lVar6 = lVar6 + 0x28;
      }
      bVar2 = QIcon::isNull((QIcon *)this);
      if (bVar2) {
        QIcon::QIcon((QIcon *)&local_70,(QString *)&local_58);
        QIcon::operator=((QIcon *)this,(QIcon *)&local_70);
        QIcon::~QIcon((QIcon *)&local_70);
      }
      else {
        QPixmap::QPixmap(&local_70,(QString *)&local_58,(char *)0x0,(ImageConversionFlags)0x0);
        QIcon::addPixmap((QIcon *)this,&local_70,mode,local_80);
        QPixmap::~QPixmap(&local_70);
      }
      lVar6 = (long)local_84;
      lVar8 = *(long *)(*in_RSI + 0x38);
      iVar5 = local_84;
      if ((lVar8 != lVar6) &&
         (iVar5 = iVar3 + 2, *(int *)(*(long *)(*in_RSI + 0x30) + lVar6 * 0x28) != 0xb)) {
        iVar5 = local_84;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    } while (lVar8 != lVar6);
    ::QVariant::fromValue<QIcon>
              ((enable_if_t<std::is_copy_constructible_v<QIcon>_&&_std::is_destructible_v<QIcon>,_QVariant>
                *)&local_58,(QIcon *)this);
    ::QVariant::operator=((QVariant *)(*in_RSI + 0x40),(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00542665;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00542665:
      __stack_chk_fail();
    }
    qvariant_cast<QIcon>((QVariant *)this);
  }
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon Declaration::iconValue() const
{
    if (d->parsed.isValid())
        return qvariant_cast<QIcon>(d->parsed);

    QIcon icon;
    for (int i = 0; i < d->values.size();) {
        const Value &value = d->values.at(i++);
        if (value.type != Value::Uri)
            break;
        QString uri = value.variant.toString();
        QIcon::Mode mode = QIcon::Normal;
        QIcon::State state = QIcon::Off;
        for (int j = 0; j < 2; j++) {
            if (i != d->values.size() && d->values.at(i).type == Value::KnownIdentifier) {
                switch (d->values.at(i).variant.toInt()) {
                case Value_Disabled: mode = QIcon::Disabled; break;
                case Value_Active: mode = QIcon::Active; break;
                case Value_Selected: mode = QIcon::Selected; break;
                case Value_Normal: mode = QIcon::Normal; break;
                case Value_On: state = QIcon::On; break;
                case Value_Off: state = QIcon::Off; break;
                default: break;
                }
                ++i;
            } else {
                break;
            }
        }

        // QIcon is soo broken
        if (icon.isNull())
            icon = QIcon(uri);
        else
            icon.addPixmap(uri, mode, state);

        if (i == d->values.size())
            break;

        if (d->values.at(i).type == Value::TermOperatorComma)
            i++;
    }

    d->parsed = QVariant::fromValue<QIcon>(icon);
    return icon;
}